

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getSolution(void *highs,double *col_value,double *col_dual,double *row_value,
                          double *row_dual)

{
  long lVar1;
  long lVar2;
  size_t i_1;
  size_t i;
  long lVar3;
  
  if (col_value != (double *)0x0) {
    lVar1 = *(long *)((long)highs + 0x10);
    lVar2 = *(long *)((long)highs + 0x18);
    for (lVar3 = 0; lVar2 - lVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
      col_value[lVar3] = *(double *)(lVar1 + lVar3 * 8);
    }
  }
  if (col_dual != (double *)0x0) {
    lVar1 = *(long *)((long)highs + 0x28);
    lVar2 = *(long *)((long)highs + 0x30);
    for (lVar3 = 0; lVar2 - lVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
      col_dual[lVar3] = *(double *)(lVar1 + lVar3 * 8);
    }
  }
  if (row_value != (double *)0x0) {
    lVar1 = *(long *)((long)highs + 0x40);
    lVar2 = *(long *)((long)highs + 0x48);
    for (lVar3 = 0; lVar2 - lVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
      row_value[lVar3] = *(double *)(lVar1 + lVar3 * 8);
    }
  }
  if (row_dual != (double *)0x0) {
    lVar1 = *(long *)((long)highs + 0x58);
    lVar2 = *(long *)((long)highs + 0x60);
    for (lVar3 = 0; lVar2 - lVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
      row_dual[lVar3] = *(double *)(lVar1 + lVar3 * 8);
    }
  }
  return 0;
}

Assistant:

HighsInt Highs_getSolution(const void* highs, double* col_value,
                           double* col_dual, double* row_value,
                           double* row_dual) {
  const HighsSolution& solution = ((Highs*)highs)->getSolution();

  if (col_value != nullptr) {
    for (size_t i = 0; i < solution.col_value.size(); i++) {
      col_value[i] = solution.col_value[i];
    }
  }

  if (col_dual != nullptr) {
    for (size_t i = 0; i < solution.col_dual.size(); i++) {
      col_dual[i] = solution.col_dual[i];
    }
  }

  if (row_value != nullptr) {
    for (size_t i = 0; i < solution.row_value.size(); i++) {
      row_value[i] = solution.row_value[i];
    }
  }

  if (row_dual != nullptr) {
    for (size_t i = 0; i < solution.row_dual.size(); i++) {
      row_dual[i] = solution.row_dual[i];
    }
  }
  return kHighsStatusOk;
}